

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_uint32_t ktxTexture2_GetNumComponents(ktxTexture2 *This)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long in_RDI;
  uint32_t channel1Id;
  uint32_t channel0Id;
  uint32_t colorModel;
  uint32_t dfdNumComponents;
  uint32_t *pBdb;
  uint32_t local_4;
  
  lVar1 = *(long *)(in_RDI + 0x80);
  local_4 = getDFDNumComponents(*(uint32_t **)(in_RDI + 0x80));
  uVar2 = *(uint *)(lVar1 + 0xc) & 0xff;
  if (0x7f < uVar2) {
    if (uVar2 == 0xa3) {
      uVar2 = *(uint *)(lVar1 + 0x1c) >> 0x18 & 0xf;
      if (local_4 == 1) {
        if (uVar2 == 0) {
          local_4 = 3;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        uVar3 = *(uint *)(lVar1 + 0x2c) >> 0x18 & 0xf;
        if ((uVar2 == 0) && (uVar3 == 0xf)) {
          local_4 = 4;
        }
        else {
          if ((uVar2 != 3) || (uVar3 != 4)) {
            __assert_fail("channel0Id == KHR_DF_CHANNEL_ETC1S_RRR && channel1Id == KHR_DF_CHANNEL_ETC1S_GGG"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                          ,0x723,"ktx_uint32_t ktxTexture2_GetNumComponents(ktxTexture2 *)");
          }
          local_4 = 2;
        }
      }
    }
    else if (uVar2 == 0xa6) {
      switch(*(byte *)(lVar1 + 0x1f) & 0xf) {
      case 0:
        local_4 = 3;
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                      ,0x735,"ktx_uint32_t ktxTexture2_GetNumComponents(ktxTexture2 *)");
      case 3:
        local_4 = 4;
        break;
      case 4:
        local_4 = 1;
        break;
      case 5:
        local_4 = 2;
      }
    }
  }
  return local_4;
}

Assistant:

ktx_uint32_t
ktxTexture2_GetNumComponents(ktxTexture2* This)
{
    uint32_t* pBdb = This->pDfd + 1;
    uint32_t dfdNumComponents = getDFDNumComponents(This->pDfd);
    uint32_t colorModel = KHR_DFDVAL(pBdb, MODEL);
    if (colorModel < KHR_DF_MODEL_DXT1A) {
        return dfdNumComponents;
    } else {
        switch (colorModel) {
          case KHR_DF_MODEL_ETC1S:
          {
            uint32_t channel0Id = KHR_DFDSVAL(pBdb, 0, CHANNELID);
            if (dfdNumComponents == 1) {
                if (channel0Id == KHR_DF_CHANNEL_ETC1S_RGB)
                    return 3;
                else
                    return 1;
            } else {
                uint32_t channel1Id = KHR_DFDSVAL(pBdb, 1, CHANNELID);
                if (channel0Id == KHR_DF_CHANNEL_ETC1S_RGB
                    && channel1Id == KHR_DF_CHANNEL_ETC1S_AAA)
                    return 4;
                else {
                    // An invalid combination of channel Ids should never
                    // have been set during creation or should have been
                    // caught when the file was loaded.
                    assert(channel0Id == KHR_DF_CHANNEL_ETC1S_RRR
                           && channel1Id == KHR_DF_CHANNEL_ETC1S_GGG);
                    return 2;
                }
            }
            break;
          }
          case KHR_DF_MODEL_UASTC:
            switch (KHR_DFDSVAL(pBdb, 0, CHANNELID)) {
              case KHR_DF_CHANNEL_UASTC_RRR:
                return 1;
              case KHR_DF_CHANNEL_UASTC_RRRG:
                return 2;
              case KHR_DF_CHANNEL_UASTC_RGB:
                return 3;
              case KHR_DF_CHANNEL_UASTC_RGBA:
                return 4;
              default:
                // Same comment as for the assert in the ETC1 case.
                assert(false);
                return 1;
            }
            break;
          default:
            return dfdNumComponents;
        }
    }
}